

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwebp.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int parse_error;
  uint8_t *data;
  size_t data_size;
  WebPDecoderConfig config;
  uint local_174;
  int local_16c;
  char *local_160;
  uint local_150 [5];
  int local_13c;
  uint8_t *local_138;
  int local_130;
  int local_12c;
  size_t local_128;
  WebPDecoderConfig local_120;
  
  local_138 = (uint8_t *)0x0;
  iVar4 = WebPInitDecoderConfigInternal(&local_120,0x210);
  if (iVar4 == 0) {
    main_cold_10();
  }
  else {
    if (argc < 2) {
      local_174 = 0;
      local_160 = (char *)0x0;
    }
    else {
      iVar4 = argc + -1;
      local_12c = argc + -4;
      local_13c = argc + -2;
      iVar8 = 1;
      local_16c = 0;
      local_160 = (char *)0x0;
      local_174 = 0;
      do {
        local_150[0] = 0;
        pcVar1 = argv[iVar8];
        iVar5 = strcmp(pcVar1,"-h");
        if ((iVar5 == 0) || (iVar5 = strcmp(pcVar1,"-help"), iVar5 == 0)) {
          puts(
              "Usage: dwebp in_file [options] [-o out_file]\n\nDecodes the WebP image file to PNG format [Default].\nNote: Animated WebP files are not supported.\n\nUse following options to convert into alternate image formats:\n  -pam ......... save the raw RGBA samples as a color PAM\n  -ppm ......... save the raw RGB samples as a color PPM\n  -bmp ......... save as uncompressed BMP format\n  -tiff ........ save as uncompressed TIFF format\n  -pgm ......... save the raw YUV samples as a grayscale PGM\n                 file with IMC4 layout\n  -yuv ......... save the raw YUV samples in flat layout\n\n Other options are:\n  -version ..... print version number and exit\n  -nofancy ..... don\'t use the fancy YUV420 upscaler\n  -nofilter .... disable in-loop filtering\n  -nodither .... disable dithering\n  -dither <d> .. dithering strength (in 0..100)\n  -alpha_dither  use alpha-plane dithering if needed\n  -mt .......... use multi-threading\n  -crop <x> <y> <w> <h> ... crop output with the given rectangle\n  -resize <w> <h> ......... resize output (*after* any cropping)\n  -flip ........ flip the output vertically\n  -alpha ....... only save the alpha plane\n  -incremental . use incremental decoding (useful for tests)\n  -h ........... this help message\n  -v ........... verbose (e.g. print encoding/decoding times)\n  -quiet ....... quiet mode, don\'t print anything\n  -noasm ....... disable all assembly optimizations"
              );
LAB_00102a49:
          local_16c = 0;
          iVar5 = 1;
        }
        else {
          iVar5 = strcmp(pcVar1,"-o");
          pcVar3 = local_160;
          if (iVar8 < iVar4 && iVar5 == 0) {
            iVar8 = iVar8 + 1;
LAB_001030e6:
            local_160 = pcVar3;
            if (local_150[0] == 0) {
              iVar5 = 0;
              goto LAB_0010310a;
            }
            puts(
                "Usage: dwebp in_file [options] [-o out_file]\n\nDecodes the WebP image file to PNG format [Default].\nNote: Animated WebP files are not supported.\n\nUse following options to convert into alternate image formats:\n  -pam ......... save the raw RGBA samples as a color PAM\n  -ppm ......... save the raw RGB samples as a color PPM\n  -bmp ......... save as uncompressed BMP format\n  -tiff ........ save as uncompressed TIFF format\n  -pgm ......... save the raw YUV samples as a grayscale PGM\n                 file with IMC4 layout\n  -yuv ......... save the raw YUV samples in flat layout\n\n Other options are:\n  -version ..... print version number and exit\n  -nofancy ..... don\'t use the fancy YUV420 upscaler\n  -nofilter .... disable in-loop filtering\n  -nodither .... disable dithering\n  -dither <d> .. dithering strength (in 0..100)\n  -alpha_dither  use alpha-plane dithering if needed\n  -mt .......... use multi-threading\n  -crop <x> <y> <w> <h> ... crop output with the given rectangle\n  -resize <w> <h> ......... resize output (*after* any cropping)\n  -flip ........ flip the output vertically\n  -alpha ....... only save the alpha plane\n  -incremental . use incremental decoding (useful for tests)\n  -h ........... this help message\n  -v ........... verbose (e.g. print encoding/decoding times)\n  -quiet ....... quiet mode, don\'t print anything\n  -noasm ....... disable all assembly optimizations"
                );
          }
          else {
            iVar5 = strcmp(pcVar1,"-alpha");
            if (iVar5 == 0) {
              local_174 = 7;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-nofancy");
            if (iVar5 == 0) {
              local_120.options.no_fancy_upsampling = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-nofilter");
            if (iVar5 == 0) {
              local_120.options.bypass_filtering = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-pam");
            if (iVar5 == 0) {
              local_174 = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-ppm");
            if (iVar5 == 0) {
              local_174 = 2;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-bmp");
            if (iVar5 == 0) {
              local_174 = 4;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-tiff");
            if (iVar5 == 0) {
              local_174 = 5;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-quiet");
            if (iVar5 == 0) {
              quiet = '\x01';
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-version");
            if (iVar5 == 0) {
              uVar6 = WebPGetDecoderVersion();
              printf("%d.%d.%d\n",(ulong)(uVar6 >> 0x10 & 0xff),(ulong)(uVar6 >> 8 & 0xff),
                     (ulong)(uVar6 & 0xff));
              goto LAB_00102a49;
            }
            iVar5 = strcmp(pcVar1,"-pgm");
            if (iVar5 == 0) {
              local_174 = 3;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-yuv");
            if (iVar5 == 0) {
              local_174 = 6;
              goto LAB_001030e6;
            }
            local_130 = iVar4;
            iVar5 = strcmp(pcVar1,"-pixel_format");
            if (iVar5 == 0 && iVar8 < iVar4) {
              iVar7 = iVar8 + 1;
              pcVar1 = argv[(long)iVar8 + 1];
              iVar5 = strcmp(pcVar1,"RGB");
              iVar8 = iVar7;
              if (iVar5 == 0) {
                local_174 = 8;
              }
              else {
                iVar5 = strcmp(pcVar1,"RGBA");
                if (iVar5 == 0) {
                  local_174 = 9;
                }
                else {
                  iVar5 = strcmp(pcVar1,"BGR");
                  if (iVar5 == 0) {
                    local_174 = 10;
                  }
                  else {
                    iVar5 = strcmp(pcVar1,"BGRA");
                    if (iVar5 == 0) {
                      local_174 = 0xb;
                    }
                    else {
                      iVar5 = strcmp(pcVar1,"ARGB");
                      if (iVar5 == 0) {
                        local_174 = 0xc;
                      }
                      else {
                        iVar5 = strcmp(pcVar1,"RGBA_4444");
                        if (iVar5 == 0) {
                          local_174 = 0xd;
                        }
                        else {
                          iVar5 = strcmp(pcVar1,"RGB_565");
                          if (iVar5 == 0) {
                            local_174 = 0xe;
                          }
                          else {
                            iVar5 = strcmp(pcVar1,"rgbA");
                            if (iVar5 == 0) {
                              local_174 = 0xf;
                            }
                            else {
                              iVar5 = strcmp(pcVar1,"bgrA");
                              if (iVar5 == 0) {
                                local_174 = 0x10;
                              }
                              else {
                                iVar5 = strcmp(pcVar1,"Argb");
                                if (iVar5 == 0) {
                                  local_174 = 0x11;
                                }
                                else {
                                  iVar5 = strcmp(pcVar1,"rgbA_4444");
                                  if (iVar5 == 0) {
                                    local_174 = 0x12;
                                  }
                                  else {
                                    iVar5 = strcmp(pcVar1,"YUV");
                                    if (iVar5 == 0) {
                                      local_174 = 0x13;
                                    }
                                    else {
                                      iVar5 = strcmp(pcVar1,"YUVA");
                                      if (iVar5 == 0) {
                                        local_174 = 0x14;
                                      }
                                      else {
                                        fprintf(stderr,"Can\'t parse pixel_format %s\n",pcVar1);
                                        local_150[0] = 1;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_001030e6;
            }
            bVar2 = iVar8 < local_130;
            iVar5 = strcmp(pcVar1,"-external_memory");
            if (iVar5 == 0 && bVar2) {
              iVar5 = iVar8 + 1;
              uVar6 = ExUtilGetInt(argv[(long)iVar8 + 1],0,(int *)local_150);
              local_150[0] = local_150[0] | 2 < uVar6;
              iVar8 = iVar5;
              if (local_150[0] != 0) {
                main_cold_2();
              }
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-mt");
            if (iVar5 == 0) {
              local_120.options.use_threads = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-alpha_dither");
            if (iVar5 == 0) {
              local_120.options.alpha_dithering_strength = 100;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-nodither");
            if (iVar5 == 0) {
              local_120.options.dithering_strength = 0;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-dither");
            if (iVar5 == 0 && iVar8 < iVar4) {
              local_120.options.dithering_strength =
                   ExUtilGetInt(argv[(long)iVar8 + 1],0,(int *)local_150);
              iVar8 = iVar8 + 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-crop");
            if (iVar8 < local_12c && iVar5 == 0) {
              local_120.options.use_cropping = 1;
              local_120.options.crop_left = ExUtilGetInt(argv[(long)iVar8 + 1],0,(int *)local_150);
              local_120.options.crop_top = ExUtilGetInt(argv[(long)iVar8 + 2],0,(int *)local_150);
              local_120.options.crop_width = ExUtilGetInt(argv[(long)iVar8 + 3],0,(int *)local_150);
              local_120.options.crop_height = ExUtilGetInt(argv[(long)iVar8 + 4],0,(int *)local_150)
              ;
              iVar8 = iVar8 + 4;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-scale");
            if (iVar5 == 0) {
              if (iVar8 < local_13c) goto LAB_00102fb6;
            }
            else {
              iVar5 = strcmp(pcVar1,"-resize");
              if (iVar5 == 0 && iVar8 < local_13c) {
LAB_00102fb6:
                local_120.options.use_scaling = 1;
                local_120.options.scaled_width =
                     ExUtilGetInt(argv[(long)iVar8 + 1],0,(int *)local_150);
                local_120.options.scaled_height =
                     ExUtilGetInt(argv[(long)iVar8 + 2],0,(int *)local_150);
                iVar8 = iVar8 + 2;
                goto LAB_001030e6;
              }
            }
            iVar5 = strcmp(pcVar1,"-flip");
            if (iVar5 == 0) {
              local_120.options.flip = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-v");
            if (iVar5 == 0) {
              verbose = 1;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-noasm");
            if (iVar5 == 0) {
              VP8GetCPUInfo = (VP8CPUInfo)0x0;
              goto LAB_001030e6;
            }
            iVar5 = strcmp(pcVar1,"-incremental");
            if (iVar5 == 0) goto LAB_001030e6;
            iVar5 = strcmp(pcVar1,"--");
            if (iVar5 == 0) {
              iVar5 = 4;
              if (iVar8 < iVar4) {
                local_160 = argv[(long)iVar8 + 1];
                iVar8 = iVar8 + 1;
              }
              goto LAB_0010310a;
            }
            pcVar3 = pcVar1;
            if (*pcVar1 != '-') goto LAB_001030e6;
            main_cold_1();
          }
          iVar5 = 1;
          local_16c = 1;
        }
LAB_0010310a:
        if (iVar5 != 0) {
          if (iVar5 != 4) {
            return local_16c;
          }
          break;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < argc);
    }
    if (local_160 != (char *)0x0) {
      if (quiet == '\x01') {
        verbose = 0;
      }
      local_128 = 0;
      iVar4 = LoadWebP(local_160,&local_138,&local_128,&local_120.input);
      if (iVar4 == 0) {
        return 1;
      }
      iVar4 = (*(code *)(&DAT_00180004 + *(int *)(&DAT_00180004 + (ulong)local_174 * 4)))();
      return iVar4;
    }
    main_cold_9();
  }
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  int ok = 0;
  const char* in_file = NULL;
  const char* out_file = NULL;

  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;
  WebPOutputFileFormat format = PNG;
  uint8_t* external_buffer = NULL;
  int use_external_memory = 0;
  const uint8_t* data = NULL;

  int incremental = 0;
  int c;

  INIT_WARGV(argc, argv);

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    int parse_error = 0;
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-o") && c < argc - 1) {
      out_file = (const char*)GET_WARGV(argv, ++c);
    } else if (!strcmp(argv[c], "-alpha")) {
      format = ALPHA_PLANE_ONLY;
    } else if (!strcmp(argv[c], "-nofancy")) {
      config.options.no_fancy_upsampling = 1;
    } else if (!strcmp(argv[c], "-nofilter")) {
      config.options.bypass_filtering = 1;
    } else if (!strcmp(argv[c], "-pam")) {
      format = PAM;
    } else if (!strcmp(argv[c], "-ppm")) {
      format = PPM;
    } else if (!strcmp(argv[c], "-bmp")) {
      format = BMP;
    } else if (!strcmp(argv[c], "-tiff")) {
      format = TIFF;
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-pgm")) {
      format = PGM;
    } else if (!strcmp(argv[c], "-yuv")) {
      format = RAW_YUV;
    } else if (!strcmp(argv[c], "-pixel_format") && c < argc - 1) {
      const char* const fmt = argv[++c];
      if      (!strcmp(fmt, "RGB"))  format = RGB;
      else if (!strcmp(fmt, "RGBA")) format = RGBA;
      else if (!strcmp(fmt, "BGR"))  format = BGR;
      else if (!strcmp(fmt, "BGRA")) format = BGRA;
      else if (!strcmp(fmt, "ARGB")) format = ARGB;
      else if (!strcmp(fmt, "RGBA_4444")) format = RGBA_4444;
      else if (!strcmp(fmt, "RGB_565")) format = RGB_565;
      else if (!strcmp(fmt, "rgbA")) format = rgbA;
      else if (!strcmp(fmt, "bgrA")) format = bgrA;
      else if (!strcmp(fmt, "Argb")) format = Argb;
      else if (!strcmp(fmt, "rgbA_4444")) format = rgbA_4444;
      else if (!strcmp(fmt, "YUV"))  format = YUV;
      else if (!strcmp(fmt, "YUVA")) format = YUVA;
      else {
        fprintf(stderr, "Can't parse pixel_format %s\n", fmt);
        parse_error = 1;
      }
    } else if (!strcmp(argv[c], "-external_memory") && c < argc - 1) {
      use_external_memory = ExUtilGetInt(argv[++c], 0, &parse_error);
      parse_error |= (use_external_memory > 2 || use_external_memory < 0);
      if (parse_error) {
        fprintf(stderr, "Can't parse 'external_memory' value %s\n", argv[c]);
      }
    } else if (!strcmp(argv[c], "-mt")) {
      config.options.use_threads = 1;
    } else if (!strcmp(argv[c], "-alpha_dither")) {
      config.options.alpha_dithering_strength = 100;
    } else if (!strcmp(argv[c], "-nodither")) {
      config.options.dithering_strength = 0;
    } else if (!strcmp(argv[c], "-dither") && c < argc - 1) {
      config.options.dithering_strength =
          ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-crop") && c < argc - 4) {
      config.options.use_cropping = 1;
      config.options.crop_left   = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_top    = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if ((!strcmp(argv[c], "-scale") || !strcmp(argv[c], "-resize")) &&
               c < argc - 2) {  // '-scale' is left for compatibility
      config.options.use_scaling = 1;
      config.options.scaled_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.scaled_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-flip")) {
      config.options.flip = 1;
    } else if (!strcmp(argv[c], "-v")) {
      verbose = 1;
#ifndef WEBP_DLL
    } else if (!strcmp(argv[c], "-noasm")) {
      VP8GetCPUInfo = NULL;
#endif
    } else if (!strcmp(argv[c], "-incremental")) {
      incremental = 1;
    } else if (!strcmp(argv[c], "--")) {
      if (c < argc - 1) in_file = (const char*)GET_WARGV(argv, ++c);
      break;
    } else if (argv[c][0] == '-') {
      fprintf(stderr, "Unknown option '%s'\n", argv[c]);
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    } else {
      in_file = (const char*)GET_WARGV(argv, c);
    }

    if (parse_error) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }
  }

  if (in_file == NULL) {
    fprintf(stderr, "missing input file!!\n");
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  if (quiet) verbose = 0;

  {
    VP8StatusCode status = VP8_STATUS_OK;
    size_t data_size = 0;
    if (!LoadWebP(in_file, &data, &data_size, bitstream)) {
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }

    switch (format) {
      case PNG:
#ifdef HAVE_WINCODEC_H
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
#else
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
#endif
        break;
      case PAM:
        output_buffer->colorspace = MODE_RGBA;
        break;
      case PPM:
        output_buffer->colorspace = MODE_RGB;  // drops alpha for PPM
        break;
      case BMP:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
        break;
      case TIFF:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
        break;
      case PGM:
      case RAW_YUV:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_YUVA : MODE_YUV;
        break;
      case ALPHA_PLANE_ONLY:
        output_buffer->colorspace = MODE_YUVA;
        break;
      // forced modes:
      case RGB: output_buffer->colorspace = MODE_RGB; break;
      case RGBA: output_buffer->colorspace = MODE_RGBA; break;
      case BGR: output_buffer->colorspace = MODE_BGR; break;
      case BGRA: output_buffer->colorspace = MODE_BGRA; break;
      case ARGB: output_buffer->colorspace = MODE_ARGB; break;
      case RGBA_4444: output_buffer->colorspace = MODE_RGBA_4444; break;
      case RGB_565: output_buffer->colorspace = MODE_RGB_565; break;
      case rgbA: output_buffer->colorspace = MODE_rgbA; break;
      case bgrA: output_buffer->colorspace = MODE_bgrA; break;
      case Argb: output_buffer->colorspace = MODE_Argb; break;
      case rgbA_4444: output_buffer->colorspace = MODE_rgbA_4444; break;
      case YUV: output_buffer->colorspace = MODE_YUV; break;
      case YUVA: output_buffer->colorspace = MODE_YUVA; break;
      default: goto Exit;
    }

    if (use_external_memory > 0 && format >= RGB) {
      external_buffer = AllocateExternalBuffer(&config, format,
                                               use_external_memory);
      if (external_buffer == NULL) goto Exit;
    }

    {
      Stopwatch stop_watch;
      if (verbose) StopwatchReset(&stop_watch);

      if (incremental) {
        status = DecodeWebPIncremental(data, data_size, &config);
      } else {
        status = DecodeWebP(data, data_size, &config);
      }
      if (verbose) {
        const double decode_time = StopwatchReadAndReset(&stop_watch);
        fprintf(stderr, "Time to decode picture: %.3fs\n", decode_time);
      }
    }

    ok = (status == VP8_STATUS_OK);
    if (!ok) {
      PrintWebPError(in_file, status);
      goto Exit;
    }
  }

  if (out_file != NULL) {
    if (!quiet) {
      WFPRINTF(stderr, "Decoded %s.", (const W_CHAR*)in_file);
      fprintf(stderr, " Dimensions: %d x %d %s. Format: %s. Now saving...\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
    }
    ok = SaveOutput(output_buffer, format, out_file);
  } else {
    if (!quiet) {
      WFPRINTF(stderr, "File %s can be decoded ", (const W_CHAR*)in_file);
      fprintf(stderr, "(dimensions: %d x %d %s. Format: %s).\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
      fprintf(stderr, "Nothing written; "
                      "use -o flag to save the result as e.g. PNG.\n");
    }
  }
 Exit:
  WebPFreeDecBuffer(output_buffer);
  WebPFree((void*)external_buffer);
  WebPFree((void*)data);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}